

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O1

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcPoint,_0UL>::Construct
                   (DB *db,LIST *params)

{
  IfcPoint *in;
  
  in = (IfcPoint *)operator_new(0x48);
  *(undefined8 *)&in->field_0x38 = 0;
  *(char **)&in->field_0x40 = "IfcPoint";
  (in->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcPoint_008af758;
  *(undefined ***)&(in->super_IfcGeometricRepresentationItem).field_0x30 = &PTR__IfcPoint_008af7d0;
  *(undefined ***)
   &(in->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 =
       &PTR__IfcPoint_008af780;
  *(undefined ***)
   &(in->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 =
       &PTR__IfcPoint_008af7a8;
  GenericFill<Assimp::IFC::Schema_2x3::IfcPoint>(db,params,in);
  return (Object *)
         ((long)&(in->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
                 super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                 _vptr_ObjectHelper +
         (long)(in->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
               super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
               _vptr_ObjectHelper[-3]);
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }